

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::NegativeCompileTime::~NegativeCompileTime(NegativeCompileTime *this)

{
  NegativeCompileTime *this_local;
  
  ~NegativeCompileTime(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual long Run()
	{
		// '#extension GL_ARB_shader_image_size : require' is missing
		if (!Compile("#version 420 core" NL "layout(location = 0) out vec4 g_color;" NL
					 "layout(binding = 0, rg16f) uniform image2D g_image;" NL "uniform ivec2 g_expected_size;" NL
					 "void main() {" NL "  if (imageSize(g_image) == g_expected_size) g_color = vec4(0, 1, 0, 1);" NL
					 "  else g_color = vec4(1, 0, 0, 1);" NL "}"))
			return ERROR;
		// imageSize(sampler)
		if (!Compile("#version 430 core" NL "layout(location = 0) out vec4 g_color;" NL
					 "layout(binding = 0) uniform sampler2D g_sampler;" NL "uniform ivec2 g_expected_size;" NL
					 "void main() {" NL "  if (imageSize(g_sampler) == g_expected_size) g_color = vec4(0, 1, 0, 1);" NL
					 "  else g_color = vec4(1, 0, 0, 1);" NL "}"))
			return ERROR;
		return NO_ERROR;
	}